

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O1

thread_priority oqpi::posix_thread::get_priority(native_handle_type handle)

{
  int iVar1;
  sched_param sVar2;
  int iVar3;
  thread_priority tVar4;
  sched_param posixPriority;
  int policy;
  sched_param local_10;
  int local_c;
  
  local_10.__sched_priority = 0;
  local_c = 2;
  iVar3 = pthread_getschedparam(handle,&local_c,&local_10);
  sVar2.__sched_priority = local_10.__sched_priority;
  if (iVar3 == 0) {
    if (get_min_priority()::minPriority == '\0') {
      get_priority();
    }
    iVar3 = sVar2.__sched_priority - get_min_priority()::minPriority;
    if (get_max_priority()::maxPriority == '\0') {
      get_priority();
    }
    iVar1 = get_max_priority()::maxPriority;
    if (get_min_priority()::minPriority == '\0') {
      get_priority();
    }
    tVar4 = (thread_priority)
            (((float)iVar3 / (float)(iVar1 - get_min_priority()::minPriority)) * 5.0);
  }
  else {
    get_priority();
    tVar4 = normal;
  }
  return tVar4;
}

Assistant:

static thread_priority get_priority(native_handle_type handle)
        {
            auto threadPriority = thread_priority::normal;
            auto posixPriority  = sched_param{};
            auto policy         = POSIX_SCHED_POLICY;
            const auto error    = pthread_getschedparam(handle, &policy, &posixPriority);

            if(error == 0)
            {
                const auto prioFrac = (posixPriority.sched_priority - get_min_priority()) / (float)(get_max_priority() - get_min_priority());
                threadPriority      = static_cast<thread_priority>(prioFrac * ((uint32_t) thread_priority::count - 1));
            }
            else
            {
                oqpi_warning("Unable to retrieve thread priority for thread %lu", get_current_thread_id());
            }

            return threadPriority;
        }